

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

Sol * earliestStart(Sol *__return_storage_ptr__,vector<ride,_std::allocator<ride>_> *rides,long vehs
                   ,long STEPS,long THRESHOLD,long rows,long cols)

{
  ride *prVar1;
  long lVar2;
  bool bVar3;
  size_type sVar4;
  const_reference pvVar5;
  ride *prVar6;
  long *plVar7;
  reference pvVar8;
  reference this;
  reference rVar9;
  long local_1e0;
  long local_1d8;
  long start_time;
  long closeness;
  _Bit_type local_1c0;
  value_type *local_1b8;
  ride *chosen;
  long min_idx;
  ride *local_1a0;
  ride *local_198;
  undefined4 local_18c;
  long local_188;
  long end_time_1;
  long local_178;
  long start_time_2;
  long closeness_2;
  _Bit_type local_160;
  const_reference local_158;
  ride *r_1;
  long i_2;
  vector<ride,_std::allocator<ride>_> idxset;
  long end_time;
  long local_120;
  long start_time_1;
  long closeness_1;
  _Bit_type local_108;
  const_reference local_100;
  ride *r;
  long i_1;
  long min_start_time;
  veh v;
  long used_rides;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long i;
  priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_> vehicles;
  allocator<bool> local_62;
  bool local_61;
  undefined1 local_60 [8];
  vector<bool,_std::allocator<bool>_> used;
  long rows_local;
  long THRESHOLD_local;
  long STEPS_local;
  long vehs_local;
  vector<ride,_std::allocator<ride>_> *rides_local;
  Sol *sol;
  
  used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage
       = (_Bit_pointer)rows;
  sVar4 = std::vector<ride,_std::allocator<ride>_>::size(rides);
  local_61 = false;
  std::allocator<bool>::allocator(&local_62);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_60,sVar4,&local_61,&local_62);
  std::allocator<bool>::~allocator(&local_62);
  vehicles._27_1_ = 0;
  std::allocator<std::vector<ride,_std::allocator<ride>_>_>::allocator
            ((allocator<std::vector<ride,_std::allocator<ride>_>_> *)&vehicles.field_0x1a);
  std::
  vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
  ::vector(__return_storage_ptr__,vehs,(allocator_type *)&vehicles.field_0x1a);
  std::allocator<std::vector<ride,_std::allocator<ride>_>_>::~allocator
            ((allocator<std::vector<ride,_std::allocator<ride>_>_> *)&vehicles.field_0x1a);
  std::priority_queue<veh,std::vector<veh,std::allocator<veh>>,std::less<veh>>::
  priority_queue<std::vector<veh,std::allocator<veh>>,void>
            ((priority_queue<veh,std::vector<veh,std::allocator<veh>>,std::less<veh>> *)&i);
  for (local_a0 = 0; local_a0 < vehs; local_a0 = local_a0 + 1) {
    used_rides = local_a0;
    local_b8 = 0;
    local_b0 = 0;
    local_a8 = 0;
    std::priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_>::push
              ((priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_> *)&i,
               (value_type *)&used_rides);
  }
  for (v.loc.y = 0; lVar2 = v.loc.y, sVar4 = std::vector<ride,_std::allocator<ride>_>::size(rides),
      (ulong)lVar2 < sVar4; v.loc.y = v.loc.y + 1) {
    pvVar5 = std::priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_>::top
                       ((priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_>
                         *)&i);
    min_start_time = pvVar5->id;
    v.id = pvVar5->avail_time;
    v.avail_time = (pvVar5->loc).x;
    v.loc.x = (pvVar5->loc).y;
    std::priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_>::pop
              ((priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_> *)&i);
    if (STEPS <= v.id) break;
    i_1 = 0x7fffffffffffffff;
    for (r = (ride *)0x0; prVar1 = r,
        prVar6 = (ride *)std::vector<ride,_std::allocator<ride>_>::size(rides), prVar1 < prVar6;
        r = (ride *)((long)&r->id + 1)) {
      local_100 = std::vector<ride,_std::allocator<ride>_>::operator[](rides,(size_type)r);
      rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)local_60,(size_type)r);
      local_108 = rVar9._M_mask;
      closeness_1 = (long)rVar9._M_p;
      bVar3 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&closeness_1);
      if ((!bVar3) && (v.id <= local_100->e_time)) {
        start_time_1 = dist((pt *)&v.avail_time,&local_100->start);
        end_time = v.id + start_time_1;
        plVar7 = std::max<long>(&end_time,&local_100->s_time);
        local_120 = *plVar7;
        idxset.super__Vector_base<ride,_std::allocator<ride>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)(local_120 + local_100->len);
        if ((local_120 < i_1) &&
           ((long)idxset.super__Vector_base<ride,_std::allocator<ride>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage <= local_100->e_time)) {
          i_1 = local_120;
        }
      }
    }
    std::vector<ride,_std::allocator<ride>_>::vector((vector<ride,_std::allocator<ride>_> *)&i_2);
    for (r_1 = (ride *)0x0; prVar1 = r_1,
        prVar6 = (ride *)std::vector<ride,_std::allocator<ride>_>::size(rides), prVar1 < prVar6;
        r_1 = (ride *)((long)&r_1->id + 1)) {
      local_158 = std::vector<ride,_std::allocator<ride>_>::operator[](rides,(size_type)r_1);
      rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)local_60,(size_type)r_1);
      local_160 = rVar9._M_mask;
      closeness_2 = (long)rVar9._M_p;
      bVar3 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&closeness_2);
      if ((!bVar3) && (v.id <= local_158->e_time)) {
        start_time_2 = dist((pt *)&v.avail_time,&local_158->start);
        end_time_1 = v.id + start_time_2;
        plVar7 = std::max<long>(&end_time_1,&local_158->s_time);
        local_178 = *plVar7;
        local_188 = local_178 + local_158->len;
        if ((local_178 < i_1 + THRESHOLD) && (local_188 <= local_158->e_time)) {
          std::vector<ride,_std::allocator<ride>_>::push_back
                    ((vector<ride,_std::allocator<ride>_> *)&i_2,local_158);
        }
      }
    }
    bVar3 = std::vector<ride,_std::allocator<ride>_>::empty
                      ((vector<ride,_std::allocator<ride>_> *)&i_2);
    if (bVar3) {
      local_18c = 7;
    }
    else {
      local_198 = (ride *)std::vector<ride,_std::allocator<ride>_>::begin
                                    ((vector<ride,_std::allocator<ride>_> *)&i_2);
      local_1a0 = (ride *)std::vector<ride,_std::allocator<ride>_>::end
                                    ((vector<ride,_std::allocator<ride>_> *)&i_2);
      std::sort<__gnu_cxx::__normal_iterator<ride*,std::vector<ride,std::allocator<ride>>>,lensort>
                (local_198,local_1a0);
      pvVar8 = std::vector<ride,_std::allocator<ride>_>::operator[]
                         ((vector<ride,_std::allocator<ride>_> *)&i_2,0);
      prVar1 = (ride *)pvVar8->id;
      bVar3 = false;
      chosen = prVar1;
      if (-1 < (long)prVar1) {
        prVar6 = (ride *)std::vector<ride,_std::allocator<ride>_>::size(rides);
        bVar3 = prVar1 < prVar6;
      }
      if (!bVar3) {
        __assert_fail("min_idx >= 0 && min_idx < rides.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/oskopek[P]ghc18/main.cpp"
                      ,0xc3,
                      "Sol earliestStart(const vector<ride> &, const long, const long, const long, const long, const long)"
                     );
      }
      local_1b8 = std::vector<ride,_std::allocator<ride>_>::operator[](rides,(size_type)chosen);
      this = std::
             vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
             ::operator[](__return_storage_ptr__,min_start_time);
      std::vector<ride,_std::allocator<ride>_>::push_back(this,local_1b8);
      rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)local_60,(size_type)chosen);
      local_1c0 = rVar9._M_mask;
      closeness = (long)rVar9._M_p;
      std::_Bit_reference::operator=((_Bit_reference *)&closeness,true);
      start_time = dist((pt *)&v.avail_time,&local_1b8->start);
      local_1e0 = v.id + start_time;
      plVar7 = std::max<long>(&local_1e0,&local_1b8->s_time);
      local_1d8 = *plVar7;
      v.id = local_1d8 + local_1b8->len;
      if (local_1b8->e_time < v.id) {
        __assert_fail("v.avail_time <= chosen.e_time",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/oskopek[P]ghc18/main.cpp"
                      ,0xce,
                      "Sol earliestStart(const vector<ride> &, const long, const long, const long, const long, const long)"
                     );
      }
      v.avail_time = (local_1b8->end).x;
      v.loc.x = (local_1b8->end).y;
      std::priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_>::push
                ((priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_> *)&i,
                 (value_type *)&min_start_time);
      local_18c = 0;
    }
    std::vector<ride,_std::allocator<ride>_>::~vector((vector<ride,_std::allocator<ride>_> *)&i_2);
  }
  vehicles._27_1_ = 1;
  local_18c = 1;
  std::priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_>::~priority_queue
            ((priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_> *)&i);
  if ((vehicles._27_1_ & 1) == 0) {
    std::
    vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_60)
  ;
  return __return_storage_ptr__;
}

Assistant:

Sol earliestStart(const vector<ride>& rides, const long vehs, const long STEPS, const long THRESHOLD, const long rows, const long cols) {
    vector<bool> used(rides.size(), false);
    Sol sol(vehs);
    priority_queue<veh> vehicles;
    for (long i = 0; i < vehs; i++) {
        vehicles.push(veh{i, 0, pt{0, 0}});
    }

    for (long used_rides = 0; used_rides < rides.size(); used_rides++) {
        veh v = vehicles.top(); vehicles.pop();
        if (v.avail_time >= STEPS) break;

        // Find closest ride
        long min_start_time = LONG_MAX;
        for (long i = 0; i < rides.size(); i++) {
            const ride& r = rides[i];
            if (used[i]) continue;
            if (r.e_time < v.avail_time) continue;
            const long closeness = dist(v.loc, r.start);
            const long start_time = max(v.avail_time + closeness, r.s_time);
            const long end_time = start_time + r.len; // max(no-wait, wait)
            if (start_time < min_start_time && end_time <= r.e_time) {
                min_start_time = start_time;
            }
        }

        vector<ride> idxset;
        for (long i = 0; i < rides.size(); i++) {
            const ride& r = rides[i];
            if (used[i]) continue;
            if (r.e_time < v.avail_time) continue;
            const long closeness = dist(v.loc, r.start);
            const long start_time = max(v.avail_time + closeness, r.s_time);
            const long end_time = start_time + r.len; // max(no-wait, wait)
            if (min_start_time + THRESHOLD > start_time && end_time <= r.e_time) {
                idxset.push_back(r);
            }
        }

        // rand num between 0 and idxset.size()
        if (idxset.empty()) continue; // leave out this car
//        if (idxset.size() > 2) cerr << "IDXSET size: " << idxset.size() << endl;

        sort(idxset.begin(), idxset.end(), lensort());
        long min_idx = idxset[0].id;
        assert(min_idx >= 0 && min_idx < rides.size());

        // Update sol
        const ride& chosen = rides[min_idx];
        sol[v.id].push_back(chosen);
        used[min_idx] = true;

        // Update vehicle
        long closeness = dist(v.loc, chosen.start);
        long start_time = max(v.avail_time + closeness, chosen.s_time);
        v.avail_time = start_time + chosen.len;
        assert(v.avail_time <= chosen.e_time);
        v.loc = chosen.end;
        vehicles.push(v);
    }

    return sol;
}